

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void output_nnybble(char *outfile,int n,uchar *array)

{
  char cVar1;
  int iVar2;
  byte *in_RDX;
  int in_ESI;
  char *in_RDI;
  int shift;
  int kk;
  int jj;
  int ii;
  int local_24;
  int local_1c;
  
  local_24 = 0;
  if (in_ESI == 1) {
    output_nybble(in_RDI,(uint)*in_RDX);
  }
  else {
    if (bits_to_go2 < 5) {
      output_nybble(in_RDI,(uint)*in_RDX);
      local_24 = 1;
      if (in_ESI == 2) {
        output_nybble(in_RDI,(uint)in_RDX[1]);
        return;
      }
    }
    cVar1 = (char)bits_to_go2;
    iVar2 = (in_ESI - local_24) / 2;
    if (bits_to_go2 == 8) {
      buffer2 = 0;
      for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
        in_RDI[noutchar] = in_RDX[local_24] << 4 | in_RDX[local_24 + 1] & 0xf;
        local_24 = local_24 + 2;
        noutchar = noutchar + 1;
      }
    }
    else {
      for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
        buffer2 = buffer2 << 8 | (in_RDX[local_24] & 0xf) << 4 | in_RDX[local_24 + 1] & 0xf;
        local_24 = local_24 + 2;
        in_RDI[noutchar] = (char)(buffer2 >> (8U - cVar1 & 0x1f));
        noutchar = noutchar + 1;
      }
    }
    bitcount = (local_1c + -1) * 8 + bitcount;
    if (local_24 != in_ESI) {
      output_nybble(in_RDI,(uint)in_RDX[in_ESI + -1]);
    }
  }
  return;
}

Assistant:

static void output_nnybble(char *outfile, int n, unsigned char array[])
{
	/* pack the 4 lower bits in each element of the array into the outfile array */

int ii, jj, kk = 0, shift;

	if (n == 1) {
		output_nybble(outfile, (int) array[0]);
		return;
	}
/* forcing byte alignment doesn;t help, and even makes it go slightly slower
if (bits_to_go2 != 8)
   output_nbits(outfile, kk, bits_to_go2);
*/
	if (bits_to_go2 <= 4)
	{
		/* just room for 1 nybble; write it out separately */
		output_nybble(outfile, array[0]);
		kk++;  /* index to next array element */

		if (n == 2)  /* only 1 more nybble to write out */
		{
			output_nybble(outfile, (int) array[1]);
			return;
		}
	}


        /* bits_to_go2 is now in the range 5 - 8 */
	shift = 8 - bits_to_go2;  

	/* now write out pairs of nybbles; this does not affect value of bits_to_go2 */
	jj = (n - kk) / 2;
	
	if (bits_to_go2 == 8) {
	    /* special case if nybbles are aligned on byte boundary */
	    /* this actually seems to make very little differnece in speed */
	    buffer2 = 0;
	    for (ii = 0; ii < jj; ii++)
	    {
		outfile[noutchar] = ((array[kk] & 15)<<4) | (array[kk+1] & 15);
		kk += 2;
		noutchar++;
	    }
	} else {
	    for (ii = 0; ii < jj; ii++)
	    {
		buffer2 = (buffer2<<8) | ((array[kk] & 15)<<4) | (array[kk+1] & 15);
		kk += 2;

		/*
		 buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>shift) & 0xff);
		noutchar++;
	    }
	}

	bitcount += (8 * (ii - 1));

	/* write out last odd nybble, if present */
	if (kk != n) output_nybble(outfile, (int) array[n - 1]); 

	return; 
}